

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  float fVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiDockNode *pIVar4;
  ImDrawList *draw_list;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiContext *ctx;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar10;
  size_t sVar11;
  char *pcVar12;
  uint flags_00;
  ImGuiTabItem *pIVar13;
  ImS8 IVar14;
  int iVar15;
  int iVar16;
  float id;
  ImGuiCol idx;
  uint uVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar21;
  float fVar22;
  float fVar23;
  bool held;
  float local_ac;
  ImGuiWindow *local_a8;
  ImVec2 local_a0;
  ImGuiTabItem *local_98;
  int local_8c;
  uint local_88;
  int local_84;
  bool hovered;
  undefined7 uStack_7f;
  float fStack_7c;
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  bool *local_68;
  char *local_60;
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  ctx = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems != false) {
    return false;
  }
  local_a0.x = (float)TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bVar18 = false;
    id = local_a0.x;
LAB_0017eefa:
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    ItemAdd(&bb,(ImGuiID)id,(ImRect *)0x0);
    PopItemFlag();
    return bVar18;
  }
  local_68 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_68 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar5 = TabItemCalcSize(label,local_68 != (bool *)0x0);
  uStack_70 = extraout_XMM0_Dc;
  local_78._0_4_ = IVar5.x;
  local_78._4_4_ = IVar5.y;
  uStack_6c = extraout_XMM0_Dd;
  id = local_a0.x;
  pIVar10 = TabBarFindTabByID(tab_bar,(ImGuiID)local_a0.x);
  local_a8 = pIVar3;
  local_60 = label;
  if (pIVar10 == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    pIVar13 = (tab_bar->Tabs).Data;
    iVar15 = (tab_bar->Tabs).Size;
    local_98 = pIVar13 + (long)iVar15 + -1;
    local_98->ID = (ImGuiID)id;
    pIVar13[(long)iVar15 + -1].Width = (float)local_78._0_4_;
    fVar23 = (float)local_78._4_4_;
  }
  else {
    pIVar13 = (tab_bar->Tabs).Data;
    local_98 = pIVar10;
    fVar23 = (float)local_78._4_4_;
  }
  pcVar7 = local_60;
  tab_bar->LastTabItemIdx = (short)(((long)local_98 - (long)pIVar13) / 0x28);
  local_98->ContentWidth = (float)local_78._0_4_;
  iVar15 = tab_bar->PrevFrameVisible;
  local_88 = tab_bar->Flags;
  iVar2 = ctx->FrameCount;
  iVar16 = local_98->LastFrameVisible + 1;
  local_98->LastFrameVisible = iVar2;
  local_98->Flags = flags_00;
  local_98->Window = docked_window;
  local_84 = iVar16;
  if ((local_88 >> 0x14 & 1) == 0) {
    iVar16 = (tab_bar->TabsNames).Buf.Size;
    iVar9 = iVar16 + -1;
    if (iVar16 == 0) {
      iVar9 = 0;
    }
    local_98->NameOffset = iVar9;
    local_78._4_4_ = fVar23;
    sVar11 = strlen(local_60);
    iVar16 = local_84;
    id = local_a0.x;
    ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar7,pcVar7 + sVar11 + 1);
    fVar23 = (float)local_78._4_4_;
  }
  else {
    local_98->NameOffset = -1;
  }
  iVar15 = iVar15 + 1;
  uVar17 = tab_bar->Flags;
  if (iVar16 < iVar2) {
    if ((((uVar17 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar2 <= iVar15 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = (ImGuiID)id;
    }
  }
  else if ((uVar17 & 1) == 0) {
    fVar22 = tab_bar->OffsetNextTab;
    local_98->Offset = fVar22;
    tab_bar->OffsetNextTab = local_98->Width + (ctx->Style).ItemInnerSpacing.x + fVar22;
  }
  if (((flags_00 & 2) != 0) && ((float)tab_bar->SelectedTabId != id)) {
    tab_bar->NextSelectedTabId = (ImGuiID)id;
  }
  if ((float)tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    bVar18 = true;
  }
  else {
    bVar18 = false;
    if (((tab_bar->SelectedTabId == 0) && (bVar18 = false, docked_window == (ImGuiWindow *)0x0)) &&
       (iVar15 < iVar2)) {
      if ((tab_bar->Tabs).Size == 1) {
        bVar18 = (uVar17 & 2) == 0;
      }
      else {
        bVar18 = false;
      }
    }
  }
  if ((iVar16 < iVar2) && (pIVar10 == (ImGuiTabItem *)0x0 || iVar2 <= iVar15)) {
    PushItemFlag(0x18,true);
    goto LAB_0017eefa;
  }
  if ((float)tab_bar->SelectedTabId == id) {
    local_98->LastFrameSelected = ctx->FrameCount;
  }
  local_a0 = (local_a8->DC).CursorPos;
  fVar22 = local_98->Width;
  IVar5 = (tab_bar->BarRect).Min;
  fVar19 = (float)(int)(local_98->Offset - tab_bar->ScrollingAnim) + IVar5.x;
  fVar20 = IVar5.y + 0.0;
  IVar5.y = fVar20;
  IVar5.x = fVar19;
  (local_a8->DC).CursorPos = IVar5;
  fVar22 = fVar22 + fVar19;
  fVar23 = fVar23 + fVar20;
  bb.Min.y = fVar20;
  bb.Min.x = fVar19;
  bb.Max.y = fVar23;
  bb.Max.x = fVar22;
  fVar1 = (tab_bar->BarRect).Min.x;
  fVar21 = (tab_bar->BarRect).Max.x;
  uVar17 = -(uint)(fVar19 < fVar1 || fVar21 < fVar22);
  local_78._0_4_ = uVar17;
  local_8c = iVar2;
  if ((uVar17 & 1) != 0) {
    fStack_7c = fVar20 + -1.0;
    _hovered = (float)(~-(uint)(fVar1 <= fVar19) & (uint)fVar1 |
                      -(uint)(fVar1 <= fVar19) & (uint)fVar19);
    _held = fVar21;
    local_ac = fVar23;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    fVar19 = bb.Min.x;
    fVar20 = bb.Min.y;
    fVar22 = bb.Max.x;
    fVar23 = bb.Max.y;
  }
  pIVar3 = local_a8;
  IVar5 = (local_a8->DC).CursorMaxPos;
  fStack_7c = fVar23 - fVar20;
  _hovered = fVar22 - fVar19;
  ItemSize((ImVec2 *)&hovered,(ctx->Style).FramePadding.y);
  (pIVar3->DC).CursorMaxPos = IVar5;
  bVar8 = ItemAdd(&bb,(ImGuiID)id,(ImRect *)0x0);
  if (!bVar8) {
    if ((_local_78 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      PopClipRect();
    }
    (local_a8->DC).CursorPos = local_a0;
    return bVar18;
  }
  if (ctx->DragDropActive == true) {
    bVar8 = ImGuiPayload::IsDataType(&ctx->DragDropPayload,"_IMWINDOW");
    uVar17 = (uint)!bVar8 << 0xc | 0x44;
  }
  else {
    uVar17 = 0x44;
  }
  iVar15 = local_8c;
  bVar8 = ButtonBehavior(&bb,(ImGuiID)id,&hovered,&held,uVar17);
  if (bVar8) {
    tab_bar->NextSelectedTabId = (ImGuiID)id;
  }
  hovered = (bool)(hovered | (float)ctx->HoveredId == id);
  if (held == false) {
    SetItemAllowOverlap();
  }
  if (((docked_window == (ImGuiWindow *)0x0) ||
      (pIVar4 = docked_window->DockNode, pIVar4 == (ImGuiDockNode *)0x0)) ||
     ((pIVar4->ParentNode != (ImGuiDockNode *)0x0 || ((pIVar4->LocalFlags & 0x400U) != 0)))) {
LAB_0017f156:
  }
  else if ((held == true) && ((pIVar4->Windows).Size == 1)) {
    bVar8 = IsMouseDragging(0,0.0);
    if (bVar8) {
      StartMouseMovingWindow(docked_window);
      goto LAB_0017f37b;
    }
    goto LAB_0017f156;
  }
  if ((((held & 1U) == 0) || (local_84 < iVar15)) || (bVar8 = IsMouseDragging(0,-1.0), !bVar8))
  goto LAB_0017f37b;
  bVar8 = ctx->DragDropActive;
  fVar23 = 0.0;
  if (bVar8 != false) goto LAB_0017f196;
  if (docked_window == (ImGuiWindow *)0x0 && (tab_bar->Flags & 1U) == 0) goto LAB_0017f37b;
  fVar22 = (ctx->IO).MouseDelta.x;
  if (0.0 <= fVar22) {
LAB_0017f2cf:
    if (0.0 < fVar22) {
      fVar22 = (ctx->IO).MousePos.x;
      if (bb.Max.x < fVar22) {
        fVar23 = fVar22 - bb.Max.x;
        IVar14 = '\x01';
        goto LAB_0017f2f5;
      }
    }
  }
  else {
    fVar1 = (ctx->IO).MousePos.x;
    if (bb.Min.x <= fVar1) goto LAB_0017f2cf;
    fVar23 = bb.Min.x - fVar1;
    IVar14 = -1;
LAB_0017f2f5:
    if ((tab_bar->Flags & 1U) != 0) {
      tab_bar->ReorderRequestTabId = local_98->ID;
      tab_bar->ReorderRequestDir = IVar14;
    }
  }
LAB_0017f196:
  if ((docked_window == (ImGuiWindow *)0x0) || ((docked_window->Flags & 4) != 0)) goto LAB_0017f37b;
  if ((bVar8 == false) || ((float)(ctx->DragDropPayload).SourceId != id)) {
    fVar22 = ctx->FontSize;
    fVar21 = (ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x) - (fVar22 + fVar22)) * 0.2;
    fVar1 = fVar22 * 4.0;
    if (fVar21 <= fVar22 * 4.0) {
      fVar1 = fVar21;
    }
    fVar19 = (ctx->IO).MousePos.y;
    fVar20 = bb.Min.y - fVar19;
    fVar19 = fVar19 - bb.Max.y;
    uVar17 = -(uint)(fVar19 <= fVar20);
    if ((float)(~uVar17 & (uint)fVar19 | (uint)fVar20 & uVar17) <
        fVar22 * 1.5 + (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar1)) {
      if (fVar23 <= fVar22 * 2.2) goto LAB_0017f37b;
      if (tab_bar->ReorderRequestDir < '\0') {
        if ((int)(((long)local_98 - (long)(tab_bar->Tabs).Data) / 0x28) != 0) goto LAB_0017f37b;
      }
      else if ((tab_bar->ReorderRequestDir == '\0') ||
              ((tab_bar->Tabs).Size + -1 !=
               (int)(((long)local_98 - (long)(tab_bar->Tabs).Data) / 0x28))) goto LAB_0017f37b;
    }
  }
  DockContextQueueUndockWindow(ctx,docked_window);
  ctx->MovingWindow = docked_window;
  ctx->ActiveId = docked_window->MoveId;
  IVar6.y = (ctx->ActiveIdClickOffset).y - ((docked_window->Pos).y - bb.Min.y);
  IVar6.x = (ctx->ActiveIdClickOffset).x - ((docked_window->Pos).x - bb.Min.x);
  ctx->ActiveIdClickOffset = IVar6;
LAB_0017f37b:
  pcVar7 = local_60;
  draw_list = local_a8->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (bVar18 == false) {
      idx = (uint)((local_88 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_88 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,flags_00,col);
  RenderNavHighlight(&bb,(ImGuiID)id,1);
  bVar8 = IsItemHovered(8);
  if ((bVar8) && ((bVar8 = IsMouseClicked(1,false), bVar8 || (bVar8 = IsMouseReleased(1), bVar8))))
  {
    tab_bar->NextSelectedTabId = (ImGuiID)id;
  }
  uVar17 = tab_bar->Flags;
  if (local_68 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = ImGuiWindow::GetID(local_a8,(void *)((ulong)(uint)id + 1));
  }
  bVar8 = TabItemLabelAndCloseButton
                    (draw_list,&bb,uVar17 >> 1 & 4 | flags_00,tab_bar->FramePadding,pcVar7,
                     (ImGuiID)id,close_button_id);
  if ((local_68 != (bool *)0x0) && (bVar8)) {
    *local_68 = false;
    TabBarCloseTab(tab_bar,local_98);
  }
  if ((_local_78 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    PopClipRect();
  }
  (local_a8->DC).CursorPos = local_a0;
  if ((float)ctx->HoveredId != id) {
    return bVar18;
  }
  if (held != false) {
    return bVar18;
  }
  if (ctx->HoveredIdNotActiveTimer <= 0.5) {
    return bVar18;
  }
  bVar8 = IsItemHovered(0);
  if (!bVar8) {
    return bVar18;
  }
  if ((tab_bar->Flags & 0x20) != 0) {
    return bVar18;
  }
  pcVar12 = FindRenderedTextEnd(pcVar7,(char *)0x0);
  SetTooltip("%.*s",(ulong)(uint)((int)pcVar12 - (int)pcVar7),pcVar7);
  return bVar18;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        IM_ASSERT(tab->Window != NULL);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                g.ActiveId = g.MovingWindow->MoveId;
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}